

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# waiter.cc
# Opt level: O3

bool __thiscall absl::synchronization_internal::Waiter::Wait(Waiter *this,KernelTimeout t)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ThreadIdentity *pTVar4;
  bool bVar5;
  bool bVar6;
  
  bVar5 = true;
  do {
    iVar2 = (this->futex_).super___atomic_base<int>._M_i;
    while (iVar2 != 0) {
      LOCK();
      iVar1 = (this->futex_).super___atomic_base<int>._M_i;
      bVar6 = iVar2 == iVar1;
      if (bVar6) {
        (this->futex_).super___atomic_base<int>._M_i = iVar2 + -1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
      if (bVar6) {
        return true;
      }
    }
    if (!bVar5) {
      pTVar4 = base_internal::CurrentThreadIdentityIfPresent();
      if (pTVar4 == (ThreadIdentity *)0x0) {
        __assert_fail("identity != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/synchronization/internal/waiter.cc"
                      ,0x3b,"void absl::synchronization_internal::MaybeBecomeIdle()");
      }
      if ((((pTVar4->is_idle)._M_base._M_i & 1U) == 0) &&
         (0x3c < (pTVar4->ticker).super___atomic_base<int>._M_i -
                 (pTVar4->wait_start).super___atomic_base<int>._M_i)) {
        (pTVar4->is_idle)._M_base._M_i = true;
      }
    }
    bVar5 = false;
    uVar3 = FutexImpl::WaitUntil(&this->futex_,0,t);
    if ((0xb < uVar3 + 0xb) || ((0x881U >> (uVar3 + 0xb & 0x1f) & 1) == 0)) {
      if (uVar3 == 0xffffff92) {
        return false;
      }
      bVar5 = false;
      raw_logging_internal::RawLog
                (kFatal,"waiter.cc",100,"Futex operation failed with error %d\n",(ulong)uVar3);
    }
  } while( true );
}

Assistant:

bool Waiter::Wait(KernelTimeout t) {
  // Loop until we can atomically decrement futex from a positive
  // value, waiting on a futex while we believe it is zero.
  // Note that, since the thread ticker is just reset, we don't need to check
  // whether the thread is idle on the very first pass of the loop.
  bool first_pass = true;

  while (true) {
    int32_t x = futex_.load(std::memory_order_relaxed);
    while (x != 0) {
      if (!futex_.compare_exchange_weak(x, x - 1,
                                        std::memory_order_acquire,
                                        std::memory_order_relaxed)) {
        continue;  // Raced with someone, retry.
      }
      return true;  // Consumed a wakeup, we are done.
    }

    if (!first_pass) MaybeBecomeIdle();
    const int err = Futex::WaitUntil(&futex_, 0, t);
    if (err != 0) {
      if (err == -EINTR || err == -EWOULDBLOCK) {
        // Do nothing, the loop will retry.
      } else if (err == -ETIMEDOUT) {
        return false;
      } else {
        ABSL_RAW_LOG(FATAL, "Futex operation failed with error %d\n", err);
      }
    }
    first_pass = false;
  }
}